

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

void __thiscall
duckdb::QuantileCursor<duckdb::dtime_t>::QuantileCursor
          (QuantileCursor<duckdb::dtime_t> *this,WindowPartitionInput *partition)

{
  ColumnDataCollection *pCVar1;
  InternalException *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  string local_50;
  
  this->inputs = *(ColumnDataCollection **)(partition + 8);
  (this->scan).current_chunk_state.handles._M_h._M_buckets =
       &(this->scan).current_chunk_state.handles._M_h._M_single_bucket;
  (this->scan).current_chunk_state.handles._M_h._M_bucket_count = 1;
  (this->scan).current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->scan).current_chunk_state.handles._M_h._M_element_count = 0;
  (this->scan).current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->scan).current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  (this->scan).current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->scan).current_chunk_state.properties = INVALID;
  (this->scan).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->scan).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->scan).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  duckdb::DataChunk::DataChunk(&this->page);
  this->data = (dtime_t *)0x0;
  this->validity = (ValidityMask *)0x0;
  pCVar1 = this->inputs;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_68,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(partition + 0x18));
  duckdb::ColumnDataCollection::InitializeScan(pCVar1,&this->scan,&local_68,1);
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  duckdb::ColumnDataCollection::InitializeScanChunk
            ((ColumnDataScanState *)this->inputs,(DataChunk *)&this->scan);
  if ((*(long *)(partition + 0x40) - (long)*(byte **)(partition + 0x30)) * 8 +
      (ulong)*(uint *)(partition + 0x48) != 0) {
    this->all_valid = (bool)(**(byte **)(partition + 0x30) & 1);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Attempted to access index %ld within vector of size %ld","");
  InternalException::InternalException<unsigned_long,unsigned_long>(this_00,&local_50,0,0);
  __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

explicit QuantileCursor(const WindowPartitionInput &partition) : inputs(*partition.inputs) {
		D_ASSERT(partition.column_ids.size() == 1);
		inputs.InitializeScan(scan, partition.column_ids);
		inputs.InitializeScanChunk(scan, page);

		D_ASSERT(partition.all_valid.size() == 1);
		all_valid = partition.all_valid[0];
	}